

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_config.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> * __thiscall
duckdb::DBConfig::GetCompressionFunctions
          (vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *__return_storage_ptr__
          ,DBConfig *this,PhysicalType physical_type)

{
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::CompressionFunction>,_std::allocator<std::reference_wrapper<duckdb::CompressionFunction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_UNCOMPRESSED,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_RLE,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_BITPACKING,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_DICTIONARY,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_CHIMP,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_PATAS,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_ALP,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_ALPRD,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_FSST,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_ZSTD,physical_type);
  TryLoadCompression(this,__return_storage_ptr__,COMPRESSION_ROARING,physical_type);
  return __return_storage_ptr__;
}

Assistant:

vector<reference<CompressionFunction>> DBConfig::GetCompressionFunctions(const PhysicalType physical_type) {
	vector<reference<CompressionFunction>> result;
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_UNCOMPRESSED, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_RLE, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_BITPACKING, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_DICTIONARY, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_CHIMP, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_PATAS, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ALP, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ALPRD, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_FSST, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ZSTD, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ROARING, physical_type);
	return result;
}